

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O3

void prf_messages_add_handler
               (int type,int level,_func_void_int_int_char_ptr_void_ptr *func,void *data)

{
  uint uVar1;
  prf_msg_handler_t *elem;
  prf_msg_handler_t **pppVar2;
  ulong uVar3;
  
  elem = (prf_msg_handler_t *)malloc(0x18);
  elem->level = level;
  elem->func = func;
  elem->userdata = data;
  uVar1 = prf_array_count(prf_handlers[type]);
  pppVar2 = prf_handlers[type];
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      if (pppVar2[uVar3] == (prf_msg_handler_t *)0x0) {
        pppVar2[uVar3] = elem;
        return;
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  pppVar2 = (prf_msg_handler_t **)prf_array_append_ptr(pppVar2,elem);
  prf_handlers[type] = pppVar2;
  return;
}

Assistant:

void
prf_messages_add_handler(
    int type,
    int level,
    void (*func)( int, int, const char *, void * ),
    void * data )
{
    prf_msg_handler_t * handler;
    int i = 0, count;
    assert( type > 0 && type < 6 );
    handler = (prf_msg_handler_t *)malloc( sizeof( prf_msg_handler_t ) );
    assert( handler != NULL );
    handler->level = level;
    handler->func = func;
    handler->userdata = data;
    count = prf_array_count( prf_handlers[type] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[type][i] == NULL ) {
            prf_handlers[type][i] = handler;
            return;
        }
    }
    prf_handlers[type] = 
      (prf_msg_handler_t **)prf_array_append_ptr( prf_handlers[type], handler);
}